

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcryptohash_test.cpp
# Opt level: O2

pint p_test_case_sha2_384_test(void)

{
  p_test_module_fail_counter = 0;
  p_libsys_init();
  general_hash_test(P_CRYPTO_HASH_TYPE_SHA2_384,0x30,"abc",
                    "abcdbcdecdefdefgefghfghighijhijkijkljklmklmnlmnomnopnopq",&DAT_00104070,
                    &DAT_001040a0,&DAT_001040d0,
                    "cb00753f45a35e8bb5a03d699ac65007272c32ab0eded1631a8b605a43ff5bed8086072ba1e7cc2358baeca134c825a7"
                    ,
                    "3391fdddfc8dc7393707a65b1b4709397cf8b1d162af05abfe8f450de5f36bc6b0455a8520bc4e6f5fe95b1fe3c8452b"
                    ,
                    "9d0e1809716474cb086e834e310a4a1ced149e9c00f248527972cec5704c2a5b07b8b3dc38ecc4ebae97ddd87f3d8985"
                    ,
                    "533e016fd92dd8a8c339328bb5401c3e700e27cd72d8230059e1d4583a506fe8187607bf899a86961af2bf5521b359eb"
                   );
  p_libsys_shutdown();
  return -(uint)(p_test_module_fail_counter != 0);
}

Assistant:

P_TEST_CASE_BEGIN (sha2_384_test)
{
	const puchar	hash_etalon_1[] = {203,   0, 117,  63,  69, 163,  94, 139, 181, 160,  61, 105,
					   154, 198,  80,   7,  39,  44,  50, 171,  14, 222, 209,  99,
					    26, 139,  96,  90,  67, 255,  91, 237, 128, 134,   7,  43,
					   161, 231, 204,  35,  88, 186, 236, 161,  52, 200,  37, 167};
	const puchar	hash_etalon_2[] = { 51, 145, 253, 221, 252, 141, 199,  57,  55,   7, 166,  91,
					    27,  71,   9,  57, 124, 248, 177, 209,  98, 175,   5, 171,
					   254, 143,  69,  13, 229, 243, 107, 198, 176,  69,  90, 133,
					    32, 188,  78, 111,  95, 233,  91,  31, 227, 200,  69,  43};
	const puchar	hash_etalon_3[] = {157,  14,  24,   9, 113, 100, 116, 203,   8, 110, 131,  78,
					    49,  10,  74,  28, 237,  20, 158, 156,   0, 242,  72,  82,
					   121, 114, 206, 197, 112,  76,  42,  91,   7, 184, 179, 220,
					    56, 236, 196, 235, 174, 151, 221, 216, 127,  61, 137, 133};

	p_libsys_init ();

	general_hash_test (P_CRYPTO_HASH_TYPE_SHA2_384,
			   48,
			   "abc",
			   "abcdbcdecdefdefgefghfghighijhijkijkljklmklmnlmnomnopnopq",
			   hash_etalon_1,
			   hash_etalon_2,
			   hash_etalon_3,
			   "cb00753f45a35e8bb5a03d699ac65007272c32ab0eded1631a8b605a43ff5bed8086072ba1e7cc2358baeca134c825a7",
			   "3391fdddfc8dc7393707a65b1b4709397cf8b1d162af05abfe8f450de5f36bc6b0455a8520bc4e6f5fe95b1fe3c8452b",
			   "9d0e1809716474cb086e834e310a4a1ced149e9c00f248527972cec5704c2a5b07b8b3dc38ecc4ebae97ddd87f3d8985",
			   "533e016fd92dd8a8c339328bb5401c3e700e27cd72d8230059e1d4583a506fe8187607bf899a86961af2bf5521b359eb");

	p_libsys_shutdown ();
}